

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall
embree::ISPCTriangleMesh::ISPCTriangleMesh
          (ISPCTriangleMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::TriangleMeshNode> *in)

{
  ulong uVar1;
  ISPCType IVar2;
  uint uVar3;
  RTCGeometry pRVar4;
  void *pvVar5;
  size_t sVar6;
  Vec3fa *pVVar7;
  size_type sVar8;
  Vec2<float> *pVVar9;
  Triangle *pTVar10;
  long *in_RCX;
  undefined8 in_RSI;
  ISPCGeometry *in_RDI;
  size_t i_1;
  size_t i;
  TriangleMeshNode *in_stack_fffffffffffffdd8;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffde0;
  TutorialScene *in_stack_fffffffffffffde8;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffffdf0;
  long *local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined8 local_a8;
  long *local_20;
  long **local_18;
  long **local_10;
  
  local_a8 = in_RSI;
  ISPCGeometry::ISPCGeometry(in_RDI,TRIANGLE_MESH);
  *(undefined8 *)(in_RDI + 1) = 0;
  in_RDI[1].geometry = (RTCGeometry)0x0;
  pRVar4 = (RTCGeometry)rtcNewGeometry(local_a8,0);
  in_RDI->geometry = pRVar4;
  SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x187982);
  pvVar5 = alignedUSMMalloc((size_t)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                            DEFAULT);
  *(void **)(in_RDI + 1) = pvVar5;
  for (local_d0 = 0; uVar1 = local_d0,
      sVar6 = SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x187a11),
      uVar1 < sVar6; local_d0 = local_d0 + 1) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RCX + 0x70),local_d0);
    pVVar7 = copyArrayToUSM<embree::Vec3fa>((avector<embree::Vec3fa> *)in_stack_fffffffffffffdd8);
    *(Vec3fa **)(*(long *)(in_RDI + 1) + local_d0 * 8) = pVVar7;
  }
  sVar8 = std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RCX + 0x88));
  if (sVar8 != 0) {
    SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x187b45);
    pRVar4 = (RTCGeometry)
             alignedUSMMalloc((size_t)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                              DEFAULT);
    in_RDI[1].geometry = pRVar4;
    for (local_d8 = 0; uVar1 = local_d8,
        sVar6 = SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x187bd4),
        uVar1 < sVar6; local_d8 = local_d8 + 1) {
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    *)(*in_RCX + 0x88),local_d8);
      pVVar7 = copyArrayToUSM<embree::Vec3fa>((avector<embree::Vec3fa> *)in_stack_fffffffffffffdd8);
      *(Vec3fa **)(in_RDI[1].geometry + local_d8 * 8) = pVVar7;
    }
  }
  pVVar9 = copyArrayToUSM<embree::Vec2<float>>(in_stack_fffffffffffffdf0);
  *(Vec2<float> **)&in_RDI[1].materialID = pVVar9;
  *(undefined4 *)&in_RDI[2].geometry = *(undefined4 *)(*in_RCX + 0x68);
  *(undefined4 *)((long)&in_RDI[2].geometry + 4) = *(undefined4 *)(*in_RCX + 0x6c);
  sVar6 = SceneGraph::TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x187d76);
  in_RDI[2].materialID = (uint)sVar6;
  sVar6 = SceneGraph::TriangleMeshNode::numVertices(in_stack_fffffffffffffdd8);
  *(int *)&in_RDI[2].visited = (int)sVar6;
  IVar2 = (**(code **)(*(long *)*in_RCX + 0x70))();
  in_RDI[3].type = IVar2;
  local_20 = (long *)(*in_RCX + 0xd0);
  local_18 = &local_e0;
  local_e0 = (long *)*local_20;
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 0x10))();
  }
  uVar3 = TutorialScene::materialID(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  in_RDI->materialID = uVar3;
  local_10 = &local_e0;
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 0x18))();
  }
  pTVar10 = copyArrayToUSM<embree::SceneGraph::TriangleMeshNode::Triangle>
                      ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)*in_RCX);
  *(Triangle **)(in_RDI + 2) = pTVar10;
  return;
}

Assistant:

ISPCTriangleMesh::ISPCTriangleMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::TriangleMeshNode> in) 
    : geom(TRIANGLE_MESH), positions(nullptr), normals(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_TRIANGLE);
   
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);
    
    if (in->normals.size()) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
      for (size_t i=0; i<in->numTimeSteps(); i++)
        normals[i] = copyArrayToUSM(in->normals[i]);
    }
    
    texcoords = copyArrayToUSM(in->texcoords);

    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numTriangles = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
    triangles = (ISPCTriangle*) copyArrayToUSM(in->triangles);
  }